

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O1

char * cmSHA1_End(SHA_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  sha_byte digest [20];
  byte local_28 [32];
  
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      pcVar4 = (char *)0x0;
      memset(context,0,0xd0);
    }
    else {
      cmSHA1_Final(local_28,context);
      lVar2 = 0;
      lVar3 = 0;
      do {
        bVar1 = local_28[lVar3];
        buffer[lVar3 * 2] = "0123456789abcdef"[bVar1 >> 4];
        buffer[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + -2;
      } while (lVar3 != 0x14);
      buffer[0x28] = '\0';
      pcVar4 = buffer + -lVar2;
    }
    return pcVar4;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                ,0x300,"char *cmSHA1_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA1_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA1_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA1_Final(digest, context);

		for (i = 0; i < SHA1_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA1_DIGEST_LENGTH);
	return buffer;
}